

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void wallet::wallet_tests::AddKey(CWallet *wallet,CKey *key)

{
  long lVar1;
  uint __line;
  reference __r;
  ScriptPubKeyMan *pSVar2;
  char *__assertion;
  long in_FS_OFFSET;
  shared_ptr<Descriptor> descriptor;
  int32_t in_stack_fffffffffffffd68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  WalletDescriptor w_desc;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string error;
  FlatSigningProvider provider;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock11,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x41,false);
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01158e68;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  EncodeSecret_abi_cxx11_(&local_170,key);
  std::operator+(&local_150,"combo(",&local_170);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w_desc,
                 &local_150,")");
  Parse(&descs,(string *)&w_desc,&provider,&error,false);
  std::__cxx11::string::~string((string *)&w_desc);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  if ((long)descs.
            super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)descs.
            super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    __r = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::at(&descs,0);
    std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
              ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffd68,__r);
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xfffffffffffffd68;
    WalletDescriptor::WalletDescriptor(&w_desc,descriptor,0,1,1,in_stack_fffffffffffffd68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"",(allocator<char> *)&local_170);
    pSVar2 = CWallet::AddWalletDescriptor(wallet,&w_desc,&provider,&local_150,false);
    std::__cxx11::string::~string((string *)&local_150);
    if (pSVar2 != (ScriptPubKeyMan *)0x0) {
      WalletDescriptor::~WalletDescriptor(&w_desc);
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::~vector(&descs);
      std::__cxx11::string::~string((string *)&error);
      FlatSigningProvider::~FlatSigningProvider(&provider);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    __assertion = "false";
    __line = 0x48;
  }
  else {
    __assertion = "descs.size() == 1";
    __line = 0x45;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                ,__line,"void wallet::wallet_tests::AddKey(CWallet &, const CKey &)");
}

Assistant:

static void AddKey(CWallet& wallet, const CKey& key)
{
    LOCK(wallet.cs_wallet);
    FlatSigningProvider provider;
    std::string error;
    auto descs = Parse("combo(" + EncodeSecret(key) + ")", provider, error, /* require_checksum=*/ false);
    assert(descs.size() == 1);
    auto& desc = descs.at(0);
    WalletDescriptor w_desc(std::move(desc), 0, 0, 1, 1);
    if (!wallet.AddWalletDescriptor(w_desc, provider, "", false)) assert(false);
}